

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSolutionMatrix.cpp
# Opt level: O0

TPZBaseMatrix * __thiscall
TPZSolutionMatrix::operator_cast_to_TPZBaseMatrix_(TPZSolutionMatrix *this)

{
  long in_RDI;
  size_t in_stack_00000408;
  char *in_stack_00000410;
  
  if (*(long *)(in_RDI + 0x130) == 0) {
    std::operator<<((ostream *)&std::cerr,
                    "TPZBaseMatrix &TPZSolutionMatrix::operator TPZBaseMatrix &()");
    std::operator<<((ostream *)&std::cerr," trying to access undefined matrix\n");
    std::operator<<((ostream *)&std::cerr,"Aborting...");
    pzinternal::DebugStopImpl(in_stack_00000410,in_stack_00000408);
  }
  return *(TPZBaseMatrix **)(in_RDI + 0x130);
}

Assistant:

TPZSolutionMatrix::operator TPZBaseMatrix &(){
  if(!fBaseMatrix){
    PZError<<__PRETTY_FUNCTION__;
    PZError<<" trying to access undefined matrix\n";
    PZError<<"Aborting...";
    DebugStop();
  }
  return *fBaseMatrix;
}